

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

void do_cmd_pref(void)

{
  _Bool _Var1;
  char tmp [80];
  char acStack_58 [80];
  
  my_strcpy(acStack_58,"",0x50);
  _Var1 = get_string("Pref: ",acStack_58,0x50);
  if (_Var1) {
    process_pref_file_command(acStack_58);
  }
  return;
}

Assistant:

void do_cmd_pref(void)
{
	char tmp[80];

	/* Default */
	my_strcpy(tmp, "", sizeof(tmp));

	/* Ask for a "user pref command" */
	if (!get_string("Pref: ", tmp, 80)) return;

	/* Process that pref command */
	(void)process_pref_file_command(tmp);
}